

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O3

void NOPLL_Clock(opll_t *chip,int32_t *buffer)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  byte bVar5;
  uint32_t uVar6;
  ulong uVar7;
  int16_t iVar8;
  uint uVar9;
  int iVar10;
  opll_patch_t *poVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  uint8_t uVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  short sVar23;
  int iVar24;
  ulong uVar25;
  byte bVar26;
  ushort uVar27;
  uint uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint uVar31;
  byte bVar32;
  uint16_t uVar33;
  ushort uVar34;
  int16_t iVar35;
  uint uVar36;
  bool bVar37;
  bool bVar38;
  byte bVar39;
  byte bVar40;
  
  *buffer = (int)chip->output_m;
  buffer[1] = (int)chip->output_r;
  uVar28 = chip->cycles;
  uVar7 = (ulong)uVar28;
  if (uVar7 == 0) {
    chip->lfo_am_out = (byte)chip->lfo_am_counter >> 3 & 0xf;
  }
  bVar32 = chip->rm_enable;
  bVar20 = (char)bVar32 >> 1;
  chip->rm_enable = bVar20;
  bVar39 = chip->write_mode_address;
  if (((bVar39 & 0x10) != 0) && (chip->write_d_en != '\0')) {
    uVar17 = bVar39 & 0xf;
    if (uVar17 < 0x10) {
      uVar9 = bVar39 & 1;
      switch(uVar17) {
      case 0:
      case 1:
        bVar32 = chip->write_data;
        (chip->patch).multi[uVar9] = bVar32 & 0xf;
        (chip->patch).ksr[uVar9] = bVar32 >> 4 & 1;
        (chip->patch).et[uVar9] = bVar32 >> 5 & 1;
        (chip->patch).vib[uVar9] = bVar32 >> 6 & 1;
        (chip->patch).am[uVar9] = bVar32 >> 7;
        break;
      case 2:
        bVar32 = chip->write_data;
        (chip->patch).ksl[0] = bVar32 >> 6;
        (chip->patch).tl = bVar32 & 0x3f;
        break;
      case 3:
        bVar32 = chip->write_data;
        (chip->patch).ksl[1] = bVar32 >> 6;
        (chip->patch).dc = bVar32 >> 4 & 1;
        (chip->patch).dm = bVar32 >> 3 & 1;
        (chip->patch).fb = bVar32 & 7;
        break;
      case 4:
      case 5:
        bVar32 = chip->write_data;
        (chip->patch).dr[uVar9] = bVar32 & 0xf;
        (chip->patch).ar[uVar9] = bVar32 >> 4;
        break;
      case 6:
      case 7:
        bVar32 = chip->write_data;
        (chip->patch).rr[uVar9] = bVar32 & 0xf;
        (chip->patch).sl[uVar9] = bVar32 >> 4;
        break;
      case 0xe:
        bVar39 = chip->write_data & 0x3f;
        chip->rhythm = bVar39;
        if (chip->chip_type == 1) {
          bVar39 = bVar39 | 0x20;
          chip->rhythm = bVar39;
        }
        bVar20 = (bVar39 & 0x20) << 2 | bVar32 >> 1;
        chip->rm_enable = bVar20;
        break;
      case 0xf:
        chip->testmode = chip->write_data & 0xf;
      }
    }
  }
  uVar9 = chip->rm_select + 1;
  uVar17 = 6;
  if (uVar9 < 6) {
    uVar17 = uVar9;
  }
  uVar9 = 0;
  if (-1 < (char)bVar20) {
    uVar9 = uVar17;
  }
  if (uVar7 != 0xb) {
    uVar9 = uVar17;
  }
  chip->rm_select = uVar9;
  uVar12 = (uVar28 + 1) / 3 & 1;
  uVar17 = ch_offset[uVar7];
  bVar32 = chip->inst[uVar17];
  if ((bVar32 == 0) && (5 < uVar9)) {
    poVar11 = &chip->patch;
LAB_0012a860:
    if (uVar12 != 0) {
      bVar32 = chip->vol[uVar17];
      goto LAB_0012a86c;
    }
    bVar32 = poVar11->tl;
  }
  else {
    uVar36 = bVar32 - 1;
    if (uVar9 < 6) {
      uVar36 = uVar9 + 0xf;
    }
    poVar11 = chip->patchrom + uVar36;
    if (1 < uVar9 - 1) goto LAB_0012a860;
LAB_0012a86c:
    bVar32 = bVar32 << 2;
  }
  chip->c_tl = bVar32;
  uVar29 = poVar11->ar[uVar12];
  chip->c_adrr[0] = uVar29;
  uVar30 = poVar11->dr[uVar12];
  chip->c_adrr[1] = uVar30;
  uVar1 = poVar11->rr[uVar12];
  chip->c_adrr[2] = uVar1;
  uVar2 = poVar11->et[uVar12];
  chip->c_et = uVar2;
  uVar3 = poVar11->ksr[uVar12];
  chip->c_ksr = uVar3;
  uVar4 = poVar11->ksl[uVar12];
  chip->c_ksl = uVar4;
  uVar34 = chip->fnum[uVar17];
  bVar26 = (byte)(uVar34 >> 8) | chip->block[uVar17] * '\x02';
  chip->c_ksr_freq = bVar26;
  bVar40 = (byte)(uVar34 >> 5);
  chip->c_ksl_freq = bVar40;
  bVar39 = chip->block[uVar17];
  chip->c_ksl_block = bVar39;
  if ((uVar7 / 3 & 1) == 0) {
    bVar37 = true;
    if ((bVar20 & 0x40) != 0) {
      bVar37 = (uVar28 + 0xf) % 0x12 < 0xc;
    }
  }
  else {
    bVar37 = false;
  }
  uVar34 = chip->ch_out;
  uVar6 = chip->chip_type;
  if (uVar6 == 1) {
    iVar35 = uVar34 - ((short)~uVar34 >> 0xf);
    if (!bVar37) {
      iVar35 = 0;
    }
    chip->output_m = iVar35;
    uVar27 = 0;
  }
  else {
    if (uVar28 < 0x12 && (bVar20 & 0x40) != 0) {
      uVar36 = 0x3063f >> ((byte)uVar28 & 0x1f);
    }
    else {
      uVar36 = 0;
    }
    if ((uVar6 == 4) || (uVar6 == 2)) {
      uVar27 = 0;
      if (bVar37) {
        uVar27 = uVar34;
      }
      chip->output_m = uVar27;
      uVar27 = 0;
      if ((uVar36 & 1) != 0) {
        uVar27 = uVar34;
      }
    }
    else {
      uVar13 = uVar34 + -((short)~uVar34 >> 0xf);
      uVar27 = -((short)~uVar34 >> 0xf) + (short)(char)(uVar34 >> 8);
      uVar34 = uVar27;
      if (bVar37) {
        uVar34 = uVar13;
      }
      chip->output_m = uVar34;
      if ((uVar36 & 1) != 0) {
        uVar27 = uVar13;
      }
    }
  }
  chip->output_r = uVar27;
  uVar18 = uVar28 + ((uVar28 + 0x11) / 0x12) * -0x12 + 0x11;
  chip->pg_phase[uVar18] = chip->pg_inc + chip->pg_phase_next;
  uVar36 = chip->pg_phase[uVar7];
  bVar5 = chip->testmode;
  if ((uVar28 - 0xd < 2) && ((bVar20 & 0x40) != 0)) {
    if ((bVar5 & 4) == 0) {
LAB_0012aaa8:
      if ((chip->eg_dokon & 1) == 0) {
LAB_0012aab9:
        uVar31 = uVar36;
        goto LAB_0012aabc;
      }
    }
    uVar31 = 0;
  }
  else {
    uVar31 = 0;
    if ((bVar5 & 4) == 0) {
      if (((ulong)(uVar28 + 3) / 3 & 1) == 0) goto LAB_0012aaa8;
      if ((chip->eg_dokon & 0x8000) == 0) goto LAB_0012aab9;
    }
  }
LAB_0012aabc:
  chip->pg_phase_next = uVar31;
  if (uVar7 == 0x11) {
    if (-1 < (char)bVar20) goto LAB_0012ab88;
    bVar21 = (byte)(uVar36 >> 0xc) & 1;
    chip->rm_tc_bit3 = bVar21;
    bVar22 = (byte)(uVar36 >> 0xe) & 1;
    chip->rm_tc_bit5 = bVar22;
    uVar36 = (uint)(byte)(bVar21 ^ bVar22 | chip->rm_hh_bit7 ^ chip->rm_hh_bit2 |
                         bVar22 ^ chip->rm_hh_bit3) << 9 | 0x100;
LAB_0012ab8c:
    chip->pg_out = (uint16_t)uVar36;
    bVar21 = bVar20 >> 7;
LAB_0012ab95:
    bVar37 = uVar12 == 0;
    bVar22 = bVar21;
  }
  else {
    if (uVar28 == 0xd) {
      chip->rm_hh_bit2 = (byte)(uVar36 >> 0xb) & 1;
      chip->rm_hh_bit3 = (byte)(uVar36 >> 0xc) & 1;
      chip->rm_hh_bit7 = (byte)(uVar36 >> 0x10) & 1;
      chip->rm_hh_bit8 = (byte)(uVar36 >> 0x11) & 1;
    }
    if (-1 < (char)bVar20) {
LAB_0012ab88:
      uVar36 = uVar36 >> 9;
      goto LAB_0012ab8c;
    }
    if (uVar7 != 0x10) {
      if (uVar28 == 0xd) {
        uVar31 = (uint)(byte)(chip->rm_tc_bit5 ^ chip->rm_tc_bit3 |
                             chip->rm_hh_bit3 ^ chip->rm_tc_bit5 |
                             chip->rm_hh_bit7 ^ chip->rm_hh_bit2);
        uVar36 = uVar31 << 9;
        if ((chip->rm_noise & 1) == uVar31) {
          uVar36 = uVar36 | 0x34;
        }
        else {
          uVar36 = uVar36 | 0xd0;
        }
        goto LAB_0012ab8c;
      }
      uVar36 = uVar36 >> 9;
      chip->pg_out = (uint16_t)uVar36;
      bVar22 = 1;
      bVar21 = 1;
      bVar37 = true;
      if (uVar28 - 0xf < 2) goto LAB_0012ab9b;
      goto LAB_0012ab95;
    }
    uVar36 = (chip->rm_noise & 1 ^ (uint)chip->rm_hh_bit8) << 8 | (uint)chip->rm_hh_bit8 << 9;
    chip->pg_out = (uint16_t)uVar36;
    bVar22 = 1;
    bVar37 = true;
  }
LAB_0012ab9b:
  if ((bVar20 & 0x40) == 0) {
    bVar38 = ((ulong)(uVar28 + 3) / 3 & 1) == 0;
LAB_0012abdb:
    if ((uVar7 / 3 & 1) == 0) goto LAB_0012abe5;
    uVar31 = chip->op_mod * 2;
  }
  else {
    bVar38 = true;
    if (1 < uVar28 - 0xd) {
      bVar38 = ((ulong)(uVar28 + 3) / 3 & 1) == 0;
    }
    if ((uVar28 & 0xfffffffe) != 0x10) goto LAB_0012abdb;
LAB_0012abe5:
    uVar31 = 0;
  }
  if ((!bVar38) && (chip->c_fb != '\0')) {
    uVar31 = uVar31 | (int)chip->op_fbsum >> (7 - chip->c_fb & 0x1f);
  }
  bVar20 = (byte)chip->op_exp_s;
  if (chip->eg_silent == '\0') {
    bVar21 = chip->op_neg;
    if ((bVar21 & 2) != 0) {
      if (bVar37) {
        bVar16 = chip->c_dc;
      }
      else {
        bVar16 = chip->c_dm;
      }
      if ((bVar16 & 4) != 0) {
        bVar20 = bVar20 | 0xc;
      }
    }
    uVar34 = (short)((char)(bVar21 << 6) >> 7) ^ chip->op_exp_m >> (bVar20 & 0x1f);
  }
  else {
    uVar34 = chip->op_exp_m >> (bVar20 & 0x1f | 0xc);
    bVar21 = chip->op_neg;
  }
  uVar14 = (uint)chip->eg_out * 0x10 + (uint)chip->op_logsin;
  if (0xffe < uVar14) {
    uVar14 = 0xfff;
  }
  chip->op_exp_m = exprom[uVar14 & 0xff];
  uVar31 = uVar31 + (uVar36 & 0xffff);
  uVar19 = uVar31 & 0x3ff;
  uVar36 = uVar19 ^ 0xff;
  if ((uVar31 >> 8 & 1) == 0) {
    uVar36 = uVar19;
  }
  chip->op_exp_s = (uint16_t)(uVar14 >> 8);
  chip->op_logsin = logsinrom[uVar36 & 0xff];
  chip->op_neg = (byte)(uVar36 >> 9) | bVar21 * '\x02';
  uVar36 = (uVar28 + 3) % 9;
  chip->op_fbsum = (int16_t)((uint)((int)chip->op_fb2[uVar36] + (int)chip->op_fb1[uVar36]) >> 1);
  if (!bVar37) {
    uVar36 = uVar28 % 9;
    chip->op_fb2[uVar36] = chip->op_fb1[uVar36];
    chip->op_fb1[uVar36] = uVar34;
  }
  chip->op_mod = uVar34 & 0x1ff;
  uVar36 = (uint)(short)uVar34;
  iVar35 = 0;
  if (uVar6 == 1) goto switchD_0012adfc_caseD_5;
  iVar35 = 0;
  switch(uVar7) {
  case 0:
    chip->ch_out_sd = (int16_t)(uVar36 >> 3);
    goto LAB_0012aec9;
  case 1:
    chip->ch_out_tc = (int16_t)(uVar36 >> 3);
    goto LAB_0012aec9;
  case 2:
    iVar35 = chip->ch_out_hh;
    break;
  case 3:
    iVar35 = chip->ch_out_tm;
    break;
  case 4:
    iVar35 = chip->ch_out_bd;
    break;
  case 8:
    iVar35 = chip->ch_out_sd;
    break;
  case 9:
    iVar35 = chip->ch_out_tc;
    break;
  case 0xf:
    chip->ch_out_hh = (int16_t)(uVar36 >> 3);
    goto LAB_0012aec9;
  case 0x10:
    chip->ch_out_tm = (int16_t)(uVar36 >> 3);
    goto LAB_0012aec9;
  case 0x11:
    chip->ch_out_bd = (int16_t)(uVar36 >> 3);
LAB_0012aec9:
    iVar35 = 0;
  }
switchD_0012adfc_caseD_5:
  iVar8 = 0;
  if (bVar22 != 0) {
    iVar8 = iVar35;
  }
  iVar35 = (int16_t)((int)uVar36 >> 3);
  if (!bVar37) {
    iVar35 = iVar8;
  }
  chip->ch_out = iVar35;
  uVar34 = chip->c_fnum;
  iVar24 = (uint)uVar34 + (uint)uVar34;
  if (chip->c_vib == '\0') goto switchD_0012af1f_caseD_4;
  switch(chip->lfo_vib_counter) {
  case '\x01':
  case '\x03':
    uVar34 = uVar34 >> 7;
    break;
  case '\x02':
    uVar34 = uVar34 >> 6;
    break;
  default:
    goto switchD_0012af1f_caseD_4;
  case '\x05':
  case '\a':
    uVar34 = uVar34 >> 7;
    goto LAB_0012af32;
  case '\x06':
    uVar34 = uVar34 >> 6;
LAB_0012af32:
    iVar24 = iVar24 - (uint)uVar34;
    goto switchD_0012af1f_caseD_4;
  }
  iVar24 = iVar24 + (uint)uVar34;
switchD_0012af1f_caseD_4:
  chip->pg_inc = ((uint)(iVar24 << ((byte)chip->c_block & 0x1f)) >> 1) * pg_multi[chip->c_multi] >>
                 1;
  uVar36 = (uint)chip->eg_ksltl + (uint)chip->eg_level[uVar18];
  if (chip->c_am != '\0') {
    uVar36 = uVar36 + chip->lfo_am_out;
  }
  uVar15 = '\x7f';
  if (uVar36 < 0x7f) {
    uVar15 = (uint8_t)uVar36;
  }
  sVar23 = 0;
  if ((bVar5 & 1) != 0) {
    uVar15 = '\0';
  }
  chip->eg_out = uVar15;
  if (uVar4 != '\0') {
    iVar10 = eg_ksltable[bVar40] + (uint)bVar39 * 8 + -0x40;
    iVar24 = 0;
    if (0 < iVar10) {
      iVar24 = iVar10;
    }
    sVar23 = (short)(iVar24 * 2 >> (3 - uVar4 & 0x1f));
  }
  chip->eg_ksltl = sVar23 + (ushort)bVar32 * 2;
  bVar32 = chip->eg_counter_state;
  bVar20 = bVar32 & 3;
  bVar39 = bVar20 == 3;
  if ((bool)bVar39 && uVar7 != 0) {
    bVar39 = chip->eg_timer_carry;
  }
  uVar36 = chip->eg_timer;
  uVar18 = (uVar36 & 1) + (uint)bVar39;
  chip->eg_timer_carry = (byte)uVar18 >> 1;
  uVar18 = (uVar18 & 1) << 0x11;
  uVar31 = uVar36 >> 1 | uVar18;
  chip->eg_timer = uVar31;
  if ((bVar5 & 8) != 0) {
    uVar31._0_1_ = chip->write_data;
    uVar31._1_1_ = chip->write_a;
    uVar31._2_1_ = chip->write_d;
    uVar31._3_1_ = chip->write_a_en;
    uVar31 = uVar36 >> 1 & 0x2ffff | uVar18 | (uVar31 & 4) << 0xe;
    chip->eg_timer = uVar31;
  }
  if ((chip->eg_timer_shift_stop == 0) && ((uVar31 & 0x10000) != 0)) {
    chip->eg_timer_shift = (byte)uVar28;
  }
  if ((uVar7 == 0) && ((chip->eg_counter_state_prev & 1) != 0)) {
    chip->eg_timer_low_lock = (byte)uVar36 & 3;
    bVar39 = 0;
    if (chip->eg_timer_shift < 0xe) {
      bVar39 = chip->eg_timer_shift;
    }
    chip->eg_timer_shift_lock = bVar39;
    chip->eg_timer_shift = '\0';
  }
  bVar39 = (byte)(uVar31 >> 0x10) & 1 | chip->eg_timer_shift_stop;
  if (uVar7 == 0) {
    bVar39 = 0;
  }
  chip->eg_timer_shift_stop = bVar39;
  chip->eg_counter_state_prev = bVar32;
  if (uVar7 == 0x11) {
    chip->eg_counter_state = bVar32 + 1;
  }
  uVar36 = (uVar28 + 0x10) % 0x12;
  bVar39 = chip->eg_level[uVar36];
  chip->eg_silent = bVar39 == 0x7f;
  bVar40 = chip->eg_state[uVar36];
  bVar21 = bVar39;
  if (((bVar40 != 0) && ((chip->eg_off & 2) != 0)) && (bVar21 = 0x7f, (chip->eg_dokon & 2) != 0)) {
    bVar21 = bVar39;
  }
  if ((chip->eg_maxrate != '\0') && ((chip->eg_dokon & 2) != 0)) {
    bVar21 = 0;
  }
  bVar22 = 0;
  if (bVar40 - 2 < 2) {
    if (((chip->eg_off & 2) != 0) || ((chip->eg_dokon & 2) != 0)) goto LAB_0012b31a;
    bVar39 = 2;
    switch(chip->eg_rate_hi) {
    case '\f':
      bVar16 = bVar20 == 3;
      if (chip->eg_inc_hi != '\0') {
        bVar16 = bVar32;
      }
      bVar37 = true;
      bVar22 = 0;
      bVar39 = 0;
      if ((bVar16 & 1) == 0) break;
      goto LAB_0012b2a6;
    case '\r':
      bVar37 = true;
      bVar22 = 0;
      bVar39 = 0;
      if ((bVar32 & 1) != 0 || chip->eg_inc_hi != '\0') goto LAB_0012b2a6;
      break;
    case '\x0e':
      if (chip->eg_inc_hi == '\0') {
        bVar37 = true;
        bVar22 = 0;
        goto LAB_0012b2a6;
      }
      break;
    case '\x0f':
      break;
    default:
      bVar39 = 0;
    }
    bVar22 = bVar39;
    bVar37 = chip->eg_inc_lo != '\0' && bVar20 == 3;
LAB_0012b2a6:
    bVar22 = bVar22 | bVar37;
  }
  else if (bVar40 == 1) {
    if ((chip->eg_off & 2) == 0) {
      uVar33 = (uint16_t)(bVar39 >> 3);
      bVar22 = 0;
      if (((chip->eg_dokon & 2) != 0) || (bVar22 = 0, uVar33 == chip->eg_sl)) goto LAB_0012b310;
      bVar22 = 2;
      switch(chip->eg_rate_hi) {
      case '\f':
        bVar39 = bVar20 == 3;
        if (chip->eg_inc_hi != '\0') {
          bVar39 = bVar32;
        }
        bVar37 = true;
        bVar22 = 0;
        if ((bVar39 & 1) == 0) break;
        goto LAB_0012b30d;
      case '\r':
        bVar37 = true;
        bVar22 = 0;
        if ((bVar32 & 1) != 0 || chip->eg_inc_hi != '\0') goto LAB_0012b30d;
        break;
      case '\x0e':
        if (chip->eg_inc_hi == '\0') {
          bVar37 = true;
          bVar22 = 0;
          goto LAB_0012b30d;
        }
        break;
      case '\x0f':
        break;
      default:
        bVar22 = 0;
      }
      bVar37 = chip->eg_inc_lo != '\0' && bVar20 == 3;
LAB_0012b30d:
      bVar22 = bVar22 | bVar37;
    }
    else {
      uVar33 = (uint16_t)(bVar39 >> 3);
      bVar22 = 0;
    }
LAB_0012b310:
    bVar40 = (uVar33 == chip->eg_sl) + 1;
  }
  else {
    bVar37 = bVar40 == 0;
    bVar40 = 0;
    bVar22 = 0;
    if (bVar37) {
      bVar22 = 0;
      if (((chip->eg_maxrate == '\0') && (bVar22 = 0, (chip->eg_kon & 2) != 0)) && (bVar39 != 0)) {
        if (chip->eg_rate_hi < 0xc) {
          uVar18 = (uint)chip->eg_inc_lo;
        }
        else {
          uVar18 = ((uint)chip->eg_rate_hi + (uint)chip->eg_inc_hi) - 0xb;
        }
        bVar22 = ~(bVar39 >> (5U - (char)uVar18 & 0x1f));
        if (uVar18 == 0) {
          bVar22 = 0;
        }
      }
      bVar40 = bVar39 == 0;
    }
  }
LAB_0012b31a:
  bVar32 = chip->eg_kon;
  bVar39 = 3;
  if ((bVar32 & 2) != 0) {
    bVar39 = bVar40;
  }
  uVar18 = chip->eg_dokon;
  bVar20 = 0;
  if ((uVar18 & 2) == 0) {
    bVar20 = bVar39;
  }
  chip->eg_level[uVar36] = bVar22 + bVar21;
  chip->eg_state[uVar36] = bVar20;
  bVar39 = chip->eg_rate;
  bVar20 = bVar39 >> 2;
  chip->eg_inc_hi =
       *(uint8_t *)
        ((long)eg_stephi[0] + (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar39 & 3) << 4));
  chip->eg_inc_lo = '\0';
  if ((bVar39 < 0x30) && (chip->eg_zerorate == '\0')) {
    bVar40 = chip->eg_timer_shift_lock + bVar20 & 0xf;
    if (bVar40 == 0xc) {
      bVar39 = 1;
    }
    else {
      if (bVar40 != 0xe) {
        if (bVar40 != 0xd) goto LAB_0012b3b6;
        bVar39 = bVar39 >> 1;
      }
      bVar39 = bVar39 & 1;
    }
    chip->eg_inc_lo = bVar39;
  }
LAB_0012b3b6:
  chip->eg_maxrate = bVar20 == 0xf;
  chip->eg_rate_hi = bVar20;
  bVar39 = bVar32 * '\x02' | chip->kon[uVar17];
  chip->eg_kon = bVar39;
  bVar32 = chip->eg_off * '\x02';
  chip->eg_off = bVar32;
  bVar20 = chip->eg_level[uVar7] & 0xfc;
  chip->eg_off = bVar20 == 0x7c | bVar32;
  switch(uVar9) {
  case 0:
  case 3:
    bVar32 = chip->rhythm >> 4;
    break;
  case 1:
    bVar32 = chip->rhythm;
    break;
  case 2:
    bVar32 = chip->rhythm >> 2;
    break;
  case 4:
    bVar32 = chip->rhythm >> 3;
    break;
  case 5:
    bVar32 = chip->rhythm >> 1;
    break;
  default:
    goto switchD_0012b40c_default;
  }
  bVar39 = bVar39 | bVar32 & 1;
  chip->eg_kon = bVar39;
switchD_0012b40c_default:
  uVar18 = uVar18 * 2;
  chip->eg_dokon = uVar18;
  switch(chip->eg_state[uVar7]) {
  case '\0':
    break;
  case '\x01':
    uVar29 = uVar30;
    break;
  case '\x02':
    uVar29 = uVar1;
    if (uVar2 != '\0') {
      uVar29 = '\0';
    }
    break;
  case '\x03':
    if (((bVar39 & 1) == 0) || (bVar20 != 0x7c)) {
      uVar29 = '\x05';
      if (chip->son[uVar17] == '\0') {
        uVar29 = uVar1;
      }
    }
    else {
      chip->eg_dokon = uVar18 | 1;
    }
    break;
  default:
    uVar29 = '\0';
  }
  uVar30 = uVar29;
  if ((uVar12 == 0) && ((bVar39 & 1) == 0)) {
    if (1 < uVar9 - 1) {
      uVar30 = '\0';
    }
  }
  else {
    if ((bVar39 & 1) == 0) {
      if ((uVar12 == 0) || (chip->son[uVar17] != '\0')) goto LAB_0012b528;
      bVar37 = uVar2 == '\0';
      uVar30 = '\a';
    }
    else {
      uVar30 = '\f';
      if (bVar20 == 0x7c) {
        uVar30 = uVar29;
      }
      bVar37 = chip->eg_state[uVar7] == '\x03';
    }
    if (!bVar37) {
      uVar30 = uVar29;
    }
  }
LAB_0012b528:
  chip->eg_zerorate = uVar30 == '\0';
  bVar32 = bVar26 >> 2;
  if (uVar3 != '\0') {
    bVar32 = bVar26;
  }
  bVar39 = uVar30 * '\x04' + bVar32;
  bVar32 = bVar32 & 3 | 0x3c;
  if ((bVar39 & 0x40) == 0) {
    bVar32 = bVar39;
  }
  chip->eg_rate = bVar32;
  chip->eg_sl = (ushort)chip->c_sl;
  if (uVar28 == 0x11) {
    uVar34 = chip->lfo_counter;
    chip->lfo_am_step = (uint8_t)((uVar34 & 0x3f) + 1 >> 6);
    chip->lfo_vib_counter =
         ((byte)((uVar34 & 0x3ff) + 1 >> 10) | bVar5 >> 3 & 1) + chip->lfo_vib_counter & 7;
    chip->lfo_counter = uVar34 + 1;
LAB_0012b5f3:
    chip->lfo_am_car = '\0';
    bVar32 = 0;
  }
  else {
    if ((bVar5 & 8) == 0 && chip->lfo_am_step == '\0') {
      if (uVar28 < 9) {
        bVar32 = 0;
        goto LAB_0012b839;
      }
      goto LAB_0012b5f3;
    }
    if (8 < uVar28) goto LAB_0012b5f3;
    bVar32 = uVar7 == 0 | chip->lfo_am_dir;
LAB_0012b839:
    if (uVar7 == 0) {
      if (chip->lfo_am_dir == '\0') {
        if ((~chip->lfo_am_counter & 0x69) == 0) {
          chip->lfo_am_dir = '\x01';
        }
      }
      else if ((chip->lfo_am_counter & 0x7f) == 0) {
        chip->lfo_am_dir = '\0';
      }
    }
  }
  bVar32 = bVar32 + chip->lfo_am_car + ((byte)chip->lfo_am_counter & 1);
  chip->lfo_am_car = bVar32 >> 1;
  uVar34 = chip->lfo_am_counter >> 1;
  chip->lfo_am_counter = (ushort)(bVar32 & 1) << 8 | uVar34;
  if ((bVar5 & 2) != 0) {
    chip->lfo_vib_counter = '\0';
    chip->lfo_counter = 0;
    chip->lfo_am_dir = '\0';
    chip->lfo_am_counter = uVar34 & 0xff;
  }
  uVar36 = chip->rm_noise;
  chip->rm_noise =
       uVar36 >> 1 |
       (uint)(((byte)(uVar36 >> 0xe) ^ (byte)uVar36 | bVar5 >> 1) & 1 | uVar36 == 0) << 0x16;
  if ((uVar9 < 6) || (chip->inst[uVar17] != 0)) {
    uVar36 = chip->inst[uVar17] - 1;
    if (uVar9 < 6) {
      uVar36 = uVar9 + 0xf;
    }
    poVar11 = chip->patchrom + uVar36;
  }
  else {
    poVar11 = &chip->patch;
  }
  chip->c_fnum = chip->fnum[uVar17];
  chip->c_block = (ushort)chip->block[uVar17];
  chip->c_multi = poVar11->multi[uVar12];
  chip->c_sl = poVar11->sl[uVar12];
  chip->c_fb = poVar11->fb;
  chip->c_vib = poVar11->vib[uVar12];
  chip->c_am = poVar11->am[uVar12];
  chip->c_dc = chip->c_dc * '\x02' | poVar11->dc;
  chip->c_dm = chip->c_dm * '\x02' | poVar11->dm;
  uVar29 = chip->write_a_en;
  if (uVar29 == '\0') {
    if (chip->write_fm_address != '\0') goto LAB_0012b763;
    if (chip->write_fm_data == '\0') goto LAB_0012b968;
    bVar37 = true;
LAB_0012b7ad:
    uVar17 = chip->address & 0xf;
    if (uVar28 == uVar17) {
      uVar25 = (ulong)(uVar28 - 9);
      if ((byte)uVar17 < 9) {
        uVar25 = uVar7;
      }
      uVar28 = chip->address & 0xfffffff0;
      if (uVar28 == 0x30) {
        bVar32 = chip->data;
        chip->vol[uVar25] = bVar32 & 0xf;
        chip->inst[uVar25] = bVar32 >> 4;
      }
      else if (uVar28 == 0x20) {
        bVar32 = chip->data;
        if (uVar6 == 5) {
          chip->fnum[uVar25] = bVar32 & 0xf | chip->fnum[uVar25] & 0x1f0;
        }
        else {
          chip->fnum[uVar25] = (bVar32 & 1) << 8 | chip->fnum[uVar25] & 0xff;
          chip->block[uVar25] = bVar32 >> 1 & 7;
        }
        chip->kon[uVar25] = bVar32 >> 4 & 1;
        chip->son[uVar25] = bVar32 >> 5 & 1;
      }
      else if (uVar28 == 0x10) {
        bVar32 = chip->data;
        if (uVar6 == 5) {
          chip->fnum[uVar25] = (bVar32 & 0x1f) << 4 | chip->fnum[uVar25] & 0xf;
          chip->block[uVar25] = bVar32 >> 5;
        }
        else {
          chip->fnum[uVar25] = (ushort)bVar32 | chip->fnum[uVar25] & 0x100;
        }
      }
    }
    if (bVar37) goto LAB_0012b968;
LAB_0012b946:
    if (chip->write_d_en != '\0') {
      chip->write_fm_data = '\x01';
    }
    if (uVar29 == '\0') goto LAB_0012b968;
    bVar32 = chip->write_data;
  }
  else {
    bVar32 = chip->write_data;
    if (bVar32 < 0x40) {
      chip->write_fm_address = '\x01';
      chip->address = bVar32;
LAB_0012b763:
      if (chip->write_d_en != '\0') {
        chip->data = chip->write_data;
      }
      if (chip->write_fm_data == '\0') {
        if (uVar29 == '\0') goto LAB_0012b946;
      }
      else if (uVar29 == '\0') {
        bVar37 = false;
        goto LAB_0012b7ad;
      }
      chip->write_fm_data = '\0';
      goto LAB_0012b946;
    }
    chip->write_fm_address = '\0';
    chip->write_fm_data = '\0';
  }
  bVar39 = bVar32 | 0x10;
  if (0xf < bVar32) {
    bVar39 = 0;
  }
  chip->write_mode_address = bVar39;
LAB_0012b968:
  chip->write_a_en = (chip->write_a & 3) == 1;
  chip->write_d_en = (chip->write_d & 3) == 1;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  chip->cycles = chip->cycles + ((chip->cycles + 1) / 0x12) * -0x12 + 1;
  return;
}

Assistant:

void NOPLL_Clock(opll_t *chip, int32_t *buffer) {
    buffer[0] = chip->output_m;
    buffer[1] = chip->output_r;
    if (chip->cycles == 0) {
        chip->lfo_am_out = (chip->lfo_am_counter >> 3) & 0x0f;
    }
    chip->rm_enable >>= 1;
    OPLL_DoModeWrite(chip);
    chip->rm_select++;
    if (chip->rm_select > rm_num_tc) {
        chip->rm_select = rm_num_tc + 1;
    }
    if (chip->cycles == 11 && (chip->rm_enable & 0x80) == 0x80) {
        chip->rm_select = rm_num_bd0;
    }
    OPLL_PreparePatch1(chip);

    OPLL_Channel(chip);

    OPLL_PhaseGenerate(chip);

    OPLL_Operator(chip);

    OPLL_PhaseCalcIncrement(chip);

    OPLL_EnvelopeOutput(chip);
    OPLL_EnvelopeKSLTL(chip);
    OPLL_EnvelopeGenerate(chip);

    OPLL_DoLFO(chip);
    OPLL_DoRhythm(chip);
    OPLL_PreparePatch2(chip);
    OPLL_DoRegWrite(chip);
    OPLL_DoIO(chip);
    chip->cycles = (chip->cycles + 1) % 18;

}